

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_player_spells(void)

{
  int local_c;
  wchar_t i;
  
  wr_u16b((uint16_t)(player->class->magic).total_spells);
  for (local_c = 0; local_c < (player->class->magic).total_spells; local_c = local_c + 1) {
    wr_byte(player->spell_flags[local_c]);
  }
  for (local_c = 0; local_c < (player->class->magic).total_spells; local_c = local_c + 1) {
    wr_byte(player->spell_order[local_c]);
  }
  return;
}

Assistant:

void wr_player_spells(void)
{
	int i;

	wr_u16b(player->class->magic.total_spells);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_flags[i]);

	for (i = 0; i < player->class->magic.total_spells; i++)
		wr_byte(player->spell_order[i]);
}